

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimitedUncertainties::ParticlePairs::
ParticlePairs<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ParticlePairs *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  ListRecord local_58;
  
  ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_58,it,end,lineNumber,MAT,MF,MT);
  Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::ParticlePairs
            ((ParticlePairs *)this,&local_58);
  if (local_58.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ParticlePairs( Iterator& it, const Iterator& end, long& lineNumber,
               int MAT, int MF, int MT )
  try : ParticlePairs( ListRecord( it, end, lineNumber, MAT, MF, MT ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing particle pairs" );
    throw;
  }